

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFYAML.cpp
# Opt level: O0

void llvm::yaml::MappingTraits<llvm::DWARFYAML::LineTable>::mapping(IO *IO,LineTable *LineTable)

{
  LineTable *LineTable_local;
  IO *IO_local;
  
  yaml::IO::mapRequired<llvm::DWARFYAML::InitialLength>(IO,"Length",&LineTable->Length);
  yaml::IO::mapRequired<unsigned_short>(IO,"Version",&LineTable->Version);
  yaml::IO::mapRequired<unsigned_long>(IO,"PrologueLength",&LineTable->PrologueLength);
  yaml::IO::mapRequired<unsigned_char>(IO,"MinInstLength",&LineTable->MinInstLength);
  if (3 < LineTable->Version) {
    yaml::IO::mapRequired<unsigned_char>(IO,"MaxOpsPerInst",&LineTable->MaxOpsPerInst);
  }
  yaml::IO::mapRequired<unsigned_char>(IO,"DefaultIsStmt",&LineTable->DefaultIsStmt);
  yaml::IO::mapRequired<signed_char>(IO,"LineBase",&LineTable->LineBase);
  yaml::IO::mapRequired<unsigned_char>(IO,"LineRange",&LineTable->LineRange);
  yaml::IO::mapRequired<unsigned_char>(IO,"OpcodeBase",&LineTable->OpcodeBase);
  yaml::IO::mapRequired<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (IO,"StandardOpcodeLengths",&LineTable->StandardOpcodeLengths);
  yaml::IO::mapRequired<std::vector<llvm::StringRef,std::allocator<llvm::StringRef>>>
            (IO,"IncludeDirs",&LineTable->IncludeDirs);
  yaml::IO::mapRequired<std::vector<llvm::DWARFYAML::File,std::allocator<llvm::DWARFYAML::File>>>
            (IO,"Files",&LineTable->Files);
  yaml::IO::
  mapRequired<std::vector<llvm::DWARFYAML::LineTableOpcode,std::allocator<llvm::DWARFYAML::LineTableOpcode>>>
            (IO,"Opcodes",&LineTable->Opcodes);
  return;
}

Assistant:

void MappingTraits<DWARFYAML::LineTable>::mapping(
    IO &IO, DWARFYAML::LineTable &LineTable) {
  IO.mapRequired("Length", LineTable.Length);
  IO.mapRequired("Version", LineTable.Version);
  IO.mapRequired("PrologueLength", LineTable.PrologueLength);
  IO.mapRequired("MinInstLength", LineTable.MinInstLength);
  if(LineTable.Version >= 4)
    IO.mapRequired("MaxOpsPerInst", LineTable.MaxOpsPerInst);
  IO.mapRequired("DefaultIsStmt", LineTable.DefaultIsStmt);
  IO.mapRequired("LineBase", LineTable.LineBase);
  IO.mapRequired("LineRange", LineTable.LineRange);
  IO.mapRequired("OpcodeBase", LineTable.OpcodeBase);
  IO.mapRequired("StandardOpcodeLengths", LineTable.StandardOpcodeLengths);
  IO.mapRequired("IncludeDirs", LineTable.IncludeDirs);
  IO.mapRequired("Files", LineTable.Files);
  IO.mapRequired("Opcodes", LineTable.Opcodes);
}